

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::writeRcFilePart(Win32MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QString *file;
  qsizetype qVar2;
  const_reference this_00;
  QTextStream *pQVar3;
  QMakeProject *this_01;
  MakefileGenerator *this_02;
  ProString *str_00;
  QTextStream *in_RSI;
  char *pcVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  ProString *path;
  int i;
  char16_t *str;
  ProString defines;
  QStringList rcDeps;
  QString incPathStr;
  ProStringList rcIncPaths;
  QString rc_file;
  ProString res_file;
  undefined4 in_stack_fffffffffffffb18;
  FileFixifyType in_stack_fffffffffffffb1c;
  QMakeProject *in_stack_fffffffffffffb20;
  QString *in_stack_fffffffffffffb28;
  ProKey *in_stack_fffffffffffffb30;
  QMakeEvaluator *in_stack_fffffffffffffb38;
  QChar sep;
  ProString *path_00;
  MakefileGenerator *in_stack_fffffffffffffb40;
  MakefileGenerator *in_stack_fffffffffffffb48;
  QTextStream *in_stack_fffffffffffffb50;
  QMakeSourceFileInfo *this_03;
  int local_464;
  undefined8 in_stack_fffffffffffffbc0;
  undefined1 canon;
  QString *in_stack_fffffffffffffbc8;
  MakefileGenerator *in_stack_fffffffffffffbd0;
  undefined1 local_3d8 [48];
  undefined1 local_3a8 [30];
  QChar local_38a [13];
  undefined1 local_370 [264];
  ProString local_268 [2];
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  QArrayDataPointer<char16_t> local_1c0 [2];
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  QList<ProString> local_148 [6];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_68 [96];
  long local_8;
  
  canon = (undefined1)((ulong)in_stack_fffffffffffffbc0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffb20,
                 (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  QMakeProject::values
            (in_stack_fffffffffffffb20,
             (ProKey *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2b8403);
  ProKey::~ProKey((ProKey *)0x2b8416);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    memset(local_68,0xaa,0x30);
    this_03 = (QMakeSourceFileInfo *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffb20,
                   (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QMakeEvaluator::first(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    ProKey::~ProKey((ProKey *)0x2b8486);
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffb20,
                   (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QMakeEvaluator::first(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18))
    ;
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffb20,
               in_stack_fffffffffffffb1c);
    MakefileGenerator::fileFixify
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,path._4_4_,(bool)canon);
    QString::~QString((QString *)0x2b854a);
    ProString::~ProString((ProString *)0x2b8557);
    ProKey::~ProKey((ProKey *)0x2b8564);
    local_148[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_148[0].d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_148[0].d.size = -0x5555555555555556;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffb20,
                   (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QMakeProject::values
              (in_stack_fffffffffffffb20,
               (ProKey *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffffb20,
               (ProStringList *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    ProKey::~ProKey((ProKey *)0x2b85e5);
    local_190 = 0xaaaaaaaaaaaaaaaa;
    local_188 = 0xaaaaaaaaaaaaaaaa;
    local_180 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b861f);
    local_464 = 0;
    while( true ) {
      file = (QString *)(long)local_464;
      qVar2 = QList<ProString>::size(local_148);
      if (qVar2 <= (long)file) break;
      this_00 = QList<ProString>::at
                          ((QList<ProString> *)in_stack_fffffffffffffb20,
                           CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      bVar1 = ProString::isEmpty(this_00);
      if (!bVar1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1c0,(Data *)0x0,L" /i ",4);
        QString::QString((QString *)in_stack_fffffffffffffb20,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        QString::operator+=((QString *)in_stack_fffffffffffffb20,
                            (QString *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
                           );
        QString::~QString((QString *)0x2b8717);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb20);
        MakefileGenerator::escapeFilePath
                  (in_stack_fffffffffffffb40,(ProString *)in_stack_fffffffffffffb38);
        ::operator+=((QString *)in_stack_fffffffffffffb40,(ProString *)in_stack_fffffffffffffb38);
        ProString::~ProString((ProString *)0x2b875d);
      }
      local_464 = local_464 + 1;
    }
    QMakeSourceFileInfo::addSourceFile
              (&in_stack_fffffffffffffb40->super_QMakeSourceFileInfo,
               (QString *)in_stack_fffffffffffffb38,
               (uchar)((ulong)in_stack_fffffffffffffb30 >> 0x38),
               (SourceFileType)in_stack_fffffffffffffb30);
    local_208 = 0xaaaaaaaaaaaaaaaa;
    local_200 = 0xaaaaaaaaaaaaaaaa;
    local_1f8 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList<QString,void>
              ((QList<QString> *)in_stack_fffffffffffffb20,
               (QString *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QMakeSourceFileInfo::dependencies(this_03,file);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffb20,
               (QList<QString> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QList<QString>::QList
              ((QList<QString> *)in_stack_fffffffffffffb20,
               (QList<QString> *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QList<QString>::~QList((QList<QString> *)0x2b881a);
    QList<QString>::~QList((QList<QString> *)0x2b8827);
    memset(local_268,0xaa,0x30);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffb20,
                   (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QString::QString(in_stack_fffffffffffffb28,(char *)file);
    QString::QString(in_stack_fffffffffffffb28,(char *)file);
    QString::QString(in_stack_fffffffffffffb28,(char *)file);
    MakefileGenerator::varGlue
              (in_stack_fffffffffffffb48,(ProKey *)in_stack_fffffffffffffb40,
               (QString *)in_stack_fffffffffffffb38,(QString *)in_stack_fffffffffffffb30,
               in_stack_fffffffffffffb28);
    ProString::ProString
              ((ProString *)in_stack_fffffffffffffb20,
               (QString *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    QString::~QString((QString *)0x2b88e2);
    QString::~QString((QString *)0x2b88ef);
    QString::~QString((QString *)0x2b88fc);
    QString::~QString((QString *)0x2b8909);
    ProKey::~ProKey((ProKey *)0x2b8916);
    bVar1 = ProString::isEmpty(local_268);
    if (bVar1) {
      ProString::ProString((ProString *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb38)
      ;
      ProString::operator=
                ((ProString *)in_stack_fffffffffffffb20,
                 (ProString *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      ProString::~ProString((ProString *)0x2b895f);
    }
    MakefileGenerator::escapeDependencyPath
              (in_stack_fffffffffffffb40,(ProString *)in_stack_fffffffffffffb38);
    sep.ucs = (char16_t)((ulong)in_stack_fffffffffffffb38 >> 0x30);
    pQVar3 = ::operator<<(in_stack_fffffffffffffb50,(ProString *)in_stack_fffffffffffffb48);
    this_01 = (QMakeProject *)QTextStream::operator<<(pQVar3,": ");
    MakefileGenerator::escapeDependencyPaths
              (in_stack_fffffffffffffb48,(QStringList *)in_stack_fffffffffffffb40);
    QChar::QChar<char,_true>(local_38a,' ');
    QListSpecialMethods<QString>::join((QListSpecialMethods<QString> *)this_01,sep);
    pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)this_01,(QString *)local_370);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"\n\t");
    ProKey::ProKey((ProKey *)in_RSI,
                   (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    (**(code **)(*in_RDI + 0xb0))(local_3a8,in_RDI,local_3d8);
    this_02 = (MakefileGenerator *)QTextStream::operator<<(pQVar3,(QString *)local_3a8);
    path_00 = (ProString *)in_RDI[0x1b];
    QString::QString((QString *)this_01,(char *)file);
    bVar1 = QMakeProject::isActiveConfig
                      (this_01,(QString *)in_RSI,SUB41(in_stack_fffffffffffffb1c >> 0x18,0));
    pcVar4 = "";
    if (bVar1) {
      pcVar4 = " -D_DEBUG";
    }
    QTextStream::operator<<((QTextStream *)this_02,pcVar4);
    pQVar3 = ::operator<<(in_stack_fffffffffffffb50,(ProString *)in_stack_fffffffffffffb48);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_190);
    str_00 = (ProString *)QTextStream::operator<<(pQVar3," -fo ");
    MakefileGenerator::escapeFilePath(this_02,path_00);
    pQVar3 = ::operator<<(in_stack_fffffffffffffb50,str_00);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
    (**(code **)(*in_RDI + 0x60))(&stack0xfffffffffffffbc8,in_RDI,&local_b0);
    QTextStream::operator<<(pQVar3,(QString *)&stack0xfffffffffffffbc8);
    QString::~QString((QString *)0x2b8b6d);
    ProString::~ProString((ProString *)0x2b8b7a);
    QString::~QString((QString *)0x2b8b87);
    QString::~QString((QString *)0x2b8b94);
    ProKey::~ProKey((ProKey *)0x2b8ba1);
    QString::~QString((QString *)0x2b8bae);
    QList<QString>::~QList((QList<QString> *)0x2b8bbb);
    ProString::~ProString((ProString *)0x2b8bc8);
    ::operator<<(in_RSI,(QTextStreamFunction)
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    ::operator<<(in_RSI,(QTextStreamFunction)
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    ProString::~ProString((ProString *)0x2b8bf8);
    QList<QString>::~QList((QList<QString> *)0x2b8c05);
    QString::~QString((QString *)0x2b8c12);
    ProStringList::~ProStringList((ProStringList *)0x2b8c1f);
    QString::~QString((QString *)0x2b8c2c);
    ProString::~ProString((ProString *)0x2b8c39);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::writeRcFilePart(QTextStream &t)
{
    if(!project->values("RC_FILE").isEmpty()) {
        const ProString res_file = project->first("RES_FILE");
        const QString rc_file = fileFixify(project->first("RC_FILE").toQString());

        const ProStringList rcIncPaths = project->values("RC_INCLUDEPATH");
        QString incPathStr;
        for (int i = 0; i < rcIncPaths.size(); ++i) {
            const ProString &path = rcIncPaths.at(i);
            if (path.isEmpty())
                continue;
            incPathStr += QStringLiteral(" /i ");
            incPathStr += escapeFilePath(path);
        }

        addSourceFile(rc_file, QMakeSourceFileInfo::SEEK_DEPS);
        const QStringList rcDeps = QStringList(rc_file) << dependencies(rc_file);

        // The resource tool may use defines. This might be the same defines passed in as the
        // compiler, since you may use these defines in the .rc file itself.
        // As the escape syntax for the command line defines for RC is different from that for CL,
        // we might have to set specific defines for RC.
        ProString defines = varGlue("RC_DEFINES", " -D", " -D", "");
        if (defines.isEmpty())
            defines = ProString(" $(DEFINES)");

        // Also, we need to add the _DEBUG define manually since the compiler defines this symbol
        // by itself, and we use it in the automatically created rc file when VERSION is defined
        // in the .pro file.
        t << escapeDependencyPath(res_file) << ": "
          << escapeDependencyPaths(rcDeps).join(' ') << "\n\t"
          << var("QMAKE_RC") << (project->isActiveConfig("debug") ? " -D_DEBUG" : "")
          << defines << incPathStr << " -fo " << escapeFilePath(res_file)
          << ' ' << escapeFilePath(rc_file);
        t << Qt::endl << Qt::endl;
    }
}